

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void __thiscall
kratos::InlineGeneratorVisitor::RenameLinkedVar::visit(RenameLinkedVar *this,AssertBase *param_1)

{
  InternalException *this_00;
  allocator<char> local_39;
  string local_38;
  AssertBase *local_18;
  AssertBase *param_1_local;
  RenameLinkedVar *this_local;
  
  local_18 = param_1;
  param_1_local = (AssertBase *)this;
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Assertion inline not implemented",&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void visit(AssertBase*) override {
            throw InternalException("Assertion inline not implemented");
        }